

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

bool __thiscall problem_parser::set_bound_variable(problem_parser *this,bound_token bound)

{
  int iVar1;
  reference pvVar2;
  double dVar3;
  int local_60;
  int local_4c;
  int id;
  problem_parser *this_local;
  
  iVar1 = get_variable(this,bound.name);
  if (iVar1 < 0) {
    this_local._7_1_ = false;
  }
  else {
    dVar3 = std::numeric_limits<double>::infinity();
    if ((bound.min != -dVar3) || (NAN(bound.min) || NAN(-dVar3))) {
      local_4c = (int)bound.min;
    }
    else {
      local_4c = std::numeric_limits<int>::min();
    }
    pvVar2 = std::vector<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>::
             operator[](&(this->m_problem).vars.values,(long)iVar1);
    pvVar2->min = local_4c;
    dVar3 = std::numeric_limits<double>::infinity();
    if ((bound.max != dVar3) || (NAN(bound.max) || NAN(dVar3))) {
      local_60 = (int)bound.max;
    }
    else {
      local_60 = std::numeric_limits<int>::max();
    }
    pvVar2 = std::vector<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>::
             operator[](&(this->m_problem).vars.values,(long)iVar1);
    pvVar2->max = local_60;
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

[[nodiscard]] bool set_bound_variable(bound_token bound)
    {
        auto id = get_variable(bound.name);
        if (id < 0)
            return false;

        // We only use a binary/integer solver.
        // m_problem.vars.values[id].min = bound.min;
        // m_problem.vars.values[id].max = bound.max;

        m_problem.vars.values[id].min =
          (bound.min == -std::numeric_limits<double>::infinity()
             ? std::numeric_limits<int>::min()
             : static_cast<int>(bound.min));

        m_problem.vars.values[id].max =
          (bound.max == std::numeric_limits<double>::infinity()
             ? std::numeric_limits<int>::max()
             : static_cast<int>(bound.max));

        return true;
    }